

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O0

void __thiscall
amrex::STLtools::read_ascii_stl_file
          (STLtools *this,string *fname,Real scale,Array<Real,_3> *center,int reverse_normal)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  istream *this_00;
  void *pvVar5;
  const_reference pvVar6;
  Triangle *pTVar7;
  int in_ECX;
  string *in_RSI;
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_> *in_RDI;
  double in_XMM0_Qa;
  int iv;
  Real z;
  Real y;
  Real x;
  int i;
  Real *p;
  int nlines_per_facet;
  int nlines;
  string tmp;
  ifstream is;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff978;
  Print *in_stack_fffffffffffff980;
  size_type in_stack_fffffffffffff988;
  double dVar8;
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>
  *in_stack_fffffffffffff990;
  double dVar9;
  ostream *in_stack_fffffffffffff9a8;
  double dVar10;
  Print *in_stack_fffffffffffff9b0;
  double dVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  Print *in_stack_fffffffffffff9f0;
  Print *this_01;
  int local_5dc;
  double local_5d8;
  double local_5d0;
  double local_5c8;
  int local_5bc;
  undefined8 local_5b8;
  undefined8 local_5b0;
  Triangle *local_420;
  undefined4 local_418;
  int local_414;
  undefined1 local_410 [64];
  istream local_3d0 [932];
  int local_2c;
  double local_20;
  string *local_18;
  char *local_8;
  
  local_2c = in_ECX;
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    iVar3 = Verbose();
    if (iVar3 != 0) {
      OutStream();
      Print::Print(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      Print::operator<<(in_stack_fffffffffffff980,(char (*) [25])in_stack_fffffffffffff978);
      Print::operator<<(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      Print::operator<<(in_stack_fffffffffffff980,(char (*) [2])in_stack_fffffffffffff978);
      Print::~Print(in_stack_fffffffffffff9f0);
    }
    std::ifstream::ifstream(local_3d0,local_18,_S_in);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      Abort(in_stack_fffffffffffff978);
      std::__cxx11::string::~string((string *)(local_410 + 0x20));
    }
    this_01 = (Print *)local_410;
    std::__cxx11::string::string((string *)this_01);
    local_414 = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3d0,(string *)this_01);
    while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3d0,(string *)local_410);
      lVar4 = std::__cxx11::string::find(local_410,0x197182b);
      if (lVar4 != -1) break;
      local_414 = local_414 + 1;
    }
    local_418 = 7;
    if (local_414 % 7 != 0) {
      local_8 = "may be there are blank lines in the STL file\n";
      Abort_host((char *)in_stack_fffffffffffff990);
    }
    *(int *)&in_RDI[3].m_data = local_414 / 7;
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_420 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::
                operator[](in_RDI,0);
    iVar3 = Verbose();
    if (iVar3 != 0) {
      OutStream();
      Print::Print(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      Print::operator<<(in_stack_fffffffffffff980,(char (*) [26])in_stack_fffffffffffff978);
      Print::operator<<(in_stack_fffffffffffff980,(int *)in_stack_fffffffffffff978);
      Print::operator<<(in_stack_fffffffffffff980,(char (*) [2])in_stack_fffffffffffff978);
      Print::~Print(this_01);
    }
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)in_stack_fffffffffffff980,(streamoff)in_stack_fffffffffffff978);
    std::istream::seekg(local_3d0,local_5b8,local_5b0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3d0,(string *)local_410);
    for (local_5bc = 0; local_5bc < *(int *)&in_RDI[3].m_data; local_5bc = local_5bc + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3d0,(string *)local_410);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3d0,(string *)local_410);
      for (local_5dc = 0; local_5dc < 3; local_5dc = local_5dc + 1) {
        this_00 = std::operator>>(local_3d0,(string *)local_410);
        pvVar5 = (void *)std::istream::operator>>(this_00,&local_5c8);
        pvVar5 = (void *)std::istream::operator>>(pvVar5,&local_5d0);
        std::istream::operator>>(pvVar5,&local_5d8);
        dVar8 = local_5c8;
        dVar9 = local_20;
        pvVar6 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)in_stack_fffffffffffff980,
                            (size_type)in_stack_fffffffffffff978);
        dVar11 = local_20;
        dVar10 = local_5d0;
        (local_420->v1).x = dVar8 * dVar9 + *pvVar6;
        local_420 = (Triangle *)&(local_420->v1).y;
        pvVar6 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)in_stack_fffffffffffff980,
                            (size_type)in_stack_fffffffffffff978);
        *(double *)local_420 = dVar10 * dVar11 + *pvVar6;
        dVar10 = local_5d8;
        dVar11 = local_20;
        local_420 = (Triangle *)((long)local_420 + 8);
        pvVar6 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)in_stack_fffffffffffff980,
                            (size_type)in_stack_fffffffffffff978);
        *(double *)local_420 = dVar10 * dVar11 + *pvVar6;
        local_420 = (Triangle *)((long)local_420 + 8);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3d0,(string *)local_410);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3d0,(string *)local_410);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3d0,(string *)local_410);
      if (local_2c != 0) {
        in_stack_fffffffffffff980 =
             (Print *)PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>
                      ::operator[](in_RDI,(long)local_5bc);
        pTVar7 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::
                 operator[](in_RDI,(long)local_5bc);
        std::swap<amrex::XDim3>((XDim3 *)in_stack_fffffffffffff980,&pTVar7->v2);
      }
    }
    std::__cxx11::string::~string((string *)local_410);
    std::ifstream::~ifstream(local_3d0);
  }
  return;
}

Assistant:

void
STLtools::read_ascii_stl_file (std::string const& fname, Real scale,
                               Array<Real,3> const& center, int reverse_normal)
{
    if (ParallelDescriptor::IOProcessor()) {
        if (amrex::Verbose()) {
            Print() << "Reading binary STL file "<< fname << "\n";
        }

        std::ifstream is(fname, std::istringstream::in);
        if (!is.good()) {
            amrex::Abort("STLtools::read_ascii_stl_file: failed to open " + fname);
        }

        std::string tmp;
        int nlines=0;

        std::getline(is,tmp); //solid <solidname>
        while(!is.eof())
        {
            std::getline(is,tmp);
            if(tmp.find("endsolid")!=std::string::npos)
            {
                break;
            }
            nlines++;
        }

        constexpr int nlines_per_facet=7; //specific to ASCII STLs
        if(nlines%nlines_per_facet!=0)
        {
            Abort("may be there are blank lines in the STL file\n");
        }

        m_num_tri = nlines / nlines_per_facet;
        m_tri_pts_h.resize(m_num_tri);
        static_assert(sizeof(Triangle) == sizeof(Real)*9, "sizeof(Triangle) is wrong");
        Real* p = &(m_tri_pts_h[0].v1.x);

        if (amrex::Verbose()) {
            Print() << "    Number of triangles: " << m_num_tri << "\n";
        }

        is.seekg(0);
        std::getline(is,tmp); //solid <solidname>

        for(int i=0; i < m_num_tri; ++i)
        {
            std::getline(is,tmp); // facet normal
            std::getline(is,tmp); // outer loop

            Real x, y, z;

            for (int iv = 0; iv < 3; ++iv) { // 3 vertices
                is >> tmp >> x >> y >> z;
                *p++ = x * scale + center[0];
                *p++ = y * scale + center[1];
                *p++ = z * scale + center[2];
            }
            std::getline(is,tmp); // read \n

            std::getline(is,tmp); //end loop
            std::getline(is,tmp); //end facet

            if (reverse_normal) {
                std::swap(m_tri_pts_h[i].v1, m_tri_pts_h[i].v2);
            }
        }
    }
}